

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcLShapeProfileDef::~IfcLShapeProfileDef
          (IfcLShapeProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcLShapeProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLShapeProfileDef,_8UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcLShapeProfileDef,_8UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,vtt + 10);
  IfcParameterizedProfileDef::~IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,vtt + 1);
  return;
}

Assistant:

IfcLShapeProfileDef() : Object("IfcLShapeProfileDef") {}